

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:1005:13),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-test.c++:1007:6)>
::getImpl(TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1005:13),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1007:6)>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::_::Void> *pEVar1;
  Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *in_00;
  Void local_4b9;
  ExceptionOr<kj::_::Void> local_4b8;
  Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *local_350;
  Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *depValue;
  ExceptionOr<kj::_::Void> local_340;
  Exception *local_1d8;
  Exception *depException;
  undefined1 local_1c0 [8];
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
  depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::_::Void,_capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1005:13),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_test_c__:1007:6)>
  *this_local;
  
  depResult.value.ptr.field_1.value.hook.ptr = (ResponseHook *)output;
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::
  ExceptionOr((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
               *)local_1c0);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_1c0);
  local_1d8 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_1c0);
  if (local_1d8 == (Exception *)0x0) {
    local_350 = readMaybe<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>>
                          ((Maybe<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
                            *)((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150
                              ));
    if (local_350 != (Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults> *)0x0) {
      in_00 = mv<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>>
                        (local_350);
      MaybeVoidCaller<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>,kj::_::Void>
      ::apply<capnp::_::(anonymous_namespace)::TestCase988::run()::__0>(&this->func,in_00);
      handle(&local_4b8,this,&local_4b9);
      pEVar1 = ExceptionOrValue::as<kj::_::Void>
                         ((ExceptionOrValue *)depResult.value.ptr.field_1.value.hook.ptr);
      ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_4b8);
      ExceptionOr<kj::_::Void>::~ExceptionOr(&local_4b8);
    }
  }
  else {
    in = mv<kj::Exception>(local_1d8);
    MaybeVoidCaller<kj::Exception,kj::_::Void>::
    apply<capnp::_::(anonymous_namespace)::TestCase988::run()::__1>(&this->errorHandler,in);
    handle(&local_340,this,(Void *)((long)&depValue + 7));
    pEVar1 = ExceptionOrValue::as<kj::_::Void>
                       ((ExceptionOrValue *)depResult.value.ptr.field_1.value.hook.ptr);
    ExceptionOr<kj::_::Void>::operator=(pEVar1,&local_340);
    ExceptionOr<kj::_::Void>::~ExceptionOr(&local_340);
  }
  ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>::
  ~ExceptionOr((ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>_>
                *)local_1c0);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }